

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::OpenPopupEx(ImGuiID id)

{
  int iVar1;
  int iVar2;
  ImGuiPopupRef *pIVar3;
  ImGuiContext *pIVar4;
  ImVec2 *pIVar5;
  ImGuiPopupRef popup_ref;
  ImGuiPopupRef local_58;
  
  pIVar4 = GImGui;
  local_58.ParentWindow = GImGui->CurrentWindow;
  iVar1 = (GImGui->BeginPopupStack).Size;
  local_58.OpenMousePos.x = 0.0;
  local_58.OpenMousePos.y = 0.0;
  local_58.Window = (ImGuiWindow *)0x0;
  iVar2 = GImGui->FrameCount;
  local_58.OpenParentId =
       ((local_58.ParentWindow)->IDStack).Data[(long)((local_58.ParentWindow)->IDStack).Size + -1];
  local_58.PopupId = id;
  local_58.OpenFrameCount = iVar2;
  local_58.OpenMousePos = NavCalcPreferredRefPos();
  local_58.OpenPopupPos = local_58.OpenMousePos;
  if (-256000.0 <= (pIVar4->IO).MousePos.x) {
    pIVar5 = &(pIVar4->IO).MousePos;
    if ((pIVar4->IO).MousePos.y < -256000.0) {
      pIVar5 = &local_58.OpenPopupPos;
    }
    local_58.OpenMousePos = *pIVar5;
  }
  if (iVar1 < (pIVar4->OpenPopupStack).Size) {
    pIVar3 = (pIVar4->OpenPopupStack).Data;
    if ((pIVar3[iVar1].PopupId == id) && (pIVar3[iVar1].OpenFrameCount == iVar2 + -1)) {
      pIVar3[iVar1].OpenFrameCount = iVar2;
    }
    else {
      ImVector<ImGuiPopupRef>::resize(&pIVar4->OpenPopupStack,iVar1 + 1);
      pIVar3 = (pIVar4->OpenPopupStack).Data;
      pIVar3[iVar1].OpenPopupPos = local_58.OpenPopupPos;
      (&pIVar3[iVar1].OpenPopupPos)[1] = local_58.OpenMousePos;
      pIVar3[iVar1].ParentWindow = local_58.ParentWindow;
      (&pIVar3[iVar1].ParentWindow)[1] =
           (ImGuiWindow *)CONCAT44(local_58.OpenParentId,local_58.OpenFrameCount);
      *(ulong *)(pIVar3 + iVar1) = CONCAT44(local_58._4_4_,local_58.PopupId);
      pIVar3[iVar1].Window = local_58.Window;
    }
  }
  else {
    ImVector<ImGuiPopupRef>::push_back(&pIVar4->OpenPopupStack,&local_58);
  }
  return;
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    int current_stack_size = g.BeginPopupStack.Size;
    ImGuiPopupRef popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.ParentWindow = parent_window;
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();
    popup_ref.OpenMousePos = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : popup_ref.OpenPopupPos;

    //IMGUI_DEBUG_LOG("OpenPopupEx(0x%08X)\n", g.FrameCount, id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
        {
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        }
        else
        {
            // Close child popups if any, then flag popup for open/reopen
            g.OpenPopupStack.resize(current_stack_size + 1);
            g.OpenPopupStack[current_stack_size] = popup_ref;
        }

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}